

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O0

uint64 ecx_readeepromFP(ecx_contextt *context,uint16 configadr,uint16 eeproma,int timeout)

{
  int iVar1;
  uint16 uVar2;
  int iVar3;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  int local_3c;
  int local_38;
  int nackcnt;
  int cnt;
  int wkc;
  ulong uStack_28;
  ec_eepromt ed;
  uint64 edat64;
  uint32 edat32;
  uint16 local_14;
  uint16 estat;
  int timeout_local;
  uint16 eeproma_local;
  uint16 configadr_local;
  ecx_contextt *context_local;
  
  local_3c = 0;
  uStack_28 = 0;
  edat64._0_4_ = 0;
  edat32 = timeout;
  local_14 = eeproma;
  estat = configadr;
  _timeout_local = context;
  uVar2 = ecx_eeprom_waitnotbusyFP(context,configadr,(uint16 *)((long)&edat64 + 6),timeout);
  if (uVar2 != 0) {
    if ((edat64._6_2_ & 0x7800) != 0) {
      edat64._6_2_ = 0;
      ecx_FPWR(_timeout_local->port,estat,0x502,2,(void *)((long)&edat64 + 6),6000);
    }
    do {
      cnt._2_2_ = 0x100;
      wkc._0_2_ = local_14;
      wkc._2_2_ = 0;
      local_38 = 0;
      do {
        iVar1 = local_38;
        iVar3 = ecx_FPWR(_timeout_local->port,estat,0x502,6,(void *)((long)&cnt + 2),2000);
        if (iVar3 < 1) {
          local_38 = local_38 + 1;
        }
        local_3d = iVar3 < 1 && iVar1 < 3;
      } while (local_3d);
      if (iVar3 != 0) {
        osal_usleep(200);
        edat64._6_2_ = 0;
        uVar2 = ecx_eeprom_waitnotbusyFP(_timeout_local,estat,(uint16 *)((long)&edat64 + 6),edat32);
        if (uVar2 != 0) {
          if ((edat64._6_2_ & 0x2000) == 0) {
            local_3c = 0;
            if ((edat64._6_2_ & 0x40) == 0) {
              local_38 = 0;
              do {
                iVar1 = local_38;
                iVar3 = ecx_FPRD(_timeout_local->port,estat,0x508,4,&edat64,2000);
                if (iVar3 < 1) {
                  local_38 = local_38 + 1;
                }
                local_3f = iVar3 < 1 && iVar1 < 3;
              } while (local_3f);
              uStack_28 = (ulong)(uint)edat64;
            }
            else {
              local_38 = 0;
              do {
                iVar1 = local_38;
                iVar3 = ecx_FPRD(_timeout_local->port,estat,0x508,8,&stack0xffffffffffffffd8,2000);
                if (iVar3 < 1) {
                  local_38 = local_38 + 1;
                }
                local_3e = iVar3 < 1 && iVar1 < 3;
              } while (local_3e);
            }
          }
          else {
            local_3c = local_3c + 1;
            osal_usleep(1000);
          }
        }
      }
      local_40 = 0 < local_3c && local_3c < 3;
    } while (local_40);
  }
  return uStack_28;
}

Assistant:

uint64 ecx_readeepromFP(ecx_contextt *context, uint16 configadr, uint16 eeproma, int timeout)
{
   uint16 estat;
   uint32 edat32;
   uint64 edat64;
   ec_eepromt ed;
   int wkc, cnt, nackcnt = 0;

   edat64 = 0;
   edat32 = 0;
   if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, timeout))
   {
      if (estat & EC_ESTAT_EMASK) /* error bits are set */
      {
         estat = htoes(EC_ECMD_NOP); /* clear error bits */
         wkc=ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(estat), &estat, EC_TIMEOUTRET3);
      }

      do
      {
         ed.comm = htoes(EC_ECMD_READ);
         ed.addr = htoes(eeproma);
         ed.d2   = 0x0000;
         cnt = 0;
         do
         {
            wkc=ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(ed), &ed, EC_TIMEOUTRET);
         }
         while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
         if (wkc)
         {
            osal_usleep(EC_LOCALDELAY);
            estat = 0x0000;
            if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, timeout))
            {
               if (estat & EC_ESTAT_NACK)
               {
                  nackcnt++;
                  osal_usleep(EC_LOCALDELAY * 5);
               }
               else
               {
                  nackcnt = 0;
                  if (estat & EC_ESTAT_R64)
                  {
                     cnt = 0;
                     do
                     {
                        wkc=ecx_FPRD(context->port, configadr, ECT_REG_EEPDAT, sizeof(edat64), &edat64, EC_TIMEOUTRET);
                     }
                     while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
                  }
                  else
                  {
                     cnt = 0;
                     do
                     {
                        wkc=ecx_FPRD(context->port, configadr, ECT_REG_EEPDAT, sizeof(edat32), &edat32, EC_TIMEOUTRET);
                     }
                     while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
                     edat64=(uint64)edat32;
                  }
               }
            }
         }
      }
      while ((nackcnt > 0) && (nackcnt < 3));
   }

   return edat64;
}